

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
CompileLanguageNode::Evaluate
          (string *__return_storage_ptr__,CompileLanguageNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  pointer pbVar1;
  __type _Var2;
  bool bVar3;
  long lVar4;
  const_iterator __begin1;
  pointer __rhs;
  string genName;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  
  if (((context->Language)._M_string_length == 0) &&
     ((dagChecker == (cmGeneratorExpressionDAGChecker *)0x0 ||
      (bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingCompileExpression(dagChecker), !bVar3))))
  {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_88,content);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,
               "$<COMPILE_LANGUAGE:...> may only be used to specify include directories, compile definitions, compile options, and to evaluate components of the file(GENERATE) command."
               ,(allocator<char> *)&local_48);
    reportError(context,&local_88,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  (*context->LG->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_88);
  lVar4 = std::__cxx11::string::find((char *)&local_88,0x7d1beb);
  if ((((lVar4 == -1) &&
       (lVar4 = std::__cxx11::string::find((char *)&local_88,0x77eba3), lVar4 == -1)) &&
      (lVar4 = std::__cxx11::string::find((char *)&local_88,0x79f022), lVar4 == -1)) &&
     (((lVar4 = std::__cxx11::string::find((char *)&local_88,0x7cc753), lVar4 == -1 &&
       (lVar4 = std::__cxx11::string::find((char *)&local_88,0x7aace9), lVar4 == -1)) &&
      (lVar4 = std::__cxx11::string::find((char *)&local_88,0x7aacc4), lVar4 == -1)))) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_68,content);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"$<COMPILE_LANGUAGE:...> not supported for this generator.",
               &local_89);
    reportError(context,&local_68,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    __rhs = (parameters->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (__rhs == pbVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&context->Language);
    }
    else {
      do {
        if (__rhs == pbVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"0",(allocator<char> *)&local_68);
          goto LAB_004d87b0;
        }
        _Var2 = std::operator==(&context->Language,__rhs);
        __rhs = __rhs + 1;
      } while (!_Var2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"1",(allocator<char> *)&local_68);
    }
  }
LAB_004d87b0:
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    if (context->Language.empty() &&
        (!dagChecker || !dagChecker->EvaluatingCompileExpression())) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<COMPILE_LANGUAGE:...> may only be used to specify include "
        "directories, compile definitions, compile options, and to evaluate "
        "components of the file(GENERATE) command.");
      return std::string();
    }

    cmGlobalGenerator* gg = context->LG->GetGlobalGenerator();
    std::string genName = gg->GetName();
    if (genName.find("Makefiles") == std::string::npos &&
        genName.find("Ninja") == std::string::npos &&
        genName.find("Visual Studio") == std::string::npos &&
        genName.find("Xcode") == std::string::npos &&
        genName.find("Watcom WMake") == std::string::npos &&
        genName.find("Green Hills MULTI") == std::string::npos) {
      reportError(context, content->GetOriginalExpression(),
                  "$<COMPILE_LANGUAGE:...> not supported for this generator.");
      return std::string();
    }
    if (parameters.empty()) {
      return context->Language;
    }

    for (auto const& param : parameters) {
      if (context->Language == param) {
        return "1";
      }
    }
    return "0";
  }